

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddFunctionCall
          (InstructionBuilder *this,uint32_t result_type,uint32_t function,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *parameters)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  pointer this_00;
  bool bVar1;
  uint32_t res_id;
  reference puVar2;
  IRContext *pIVar3;
  Instruction *this_01;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_150
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> new_inst;
  uint local_13c;
  uint32_t result_id;
  undefined8 local_130;
  SmallVector<unsigned_int,_2UL> local_128;
  Operand local_100;
  uint local_cc;
  const_iterator cStack_c8;
  uint32_t id;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  iterator local_a8;
  undefined8 local_a0;
  SmallVector<unsigned_int,_2UL> local_98;
  Operand local_70;
  undefined1 local_40 [8];
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *parameters_local;
  uint32_t function_local;
  uint32_t result_type_local;
  InstructionBuilder *this_local;
  
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)parameters;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_40);
  local_a8 = (iterator)((long)&__range2 + 4);
  local_a0 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_a8;
  __range2._4_4_ = function;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_98,init_list_00);
  Operand::Operand(&local_70,SPV_OPERAND_TYPE_ID,&local_98);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_40,
             &local_70);
  Operand::~Operand(&local_70);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_98);
  this_00 = operands.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      operands.
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cStack_c8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff38);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    local_13c = *puVar2;
    _result_id = &local_13c;
    local_130 = 1;
    init_list._M_len = 1;
    init_list._M_array = _result_id;
    local_cc = local_13c;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_128,init_list);
    Operand::Operand(&local_100,SPV_OPERAND_TYPE_ID,&local_128);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_40,
               &local_100);
    Operand::~Operand(&local_100);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_128);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  }
  pIVar3 = GetContext(this);
  res_id = IRContext::TakeNextId(pIVar3);
  if (res_id == 0) {
    this_local = (InstructionBuilder *)0x0;
    new_inst._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = 1;
  }
  else {
    this_01 = (Instruction *)::operator_new(0x70);
    pIVar3 = GetContext(this);
    opt::Instruction::Instruction
              (this_01,pIVar3,OpFunctionCall,result_type,res_id,(OperandList *)local_40);
    std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
    unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
              ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                *)&local_150,this_01);
    this_local = (InstructionBuilder *)AddInstruction(this,&local_150);
    new_inst._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = 1;
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_150);
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_40);
  return (Instruction *)this_local;
}

Assistant:

Instruction* AddFunctionCall(uint32_t result_type, uint32_t function,
                               const std::vector<uint32_t>& parameters) {
    std::vector<Operand> operands;
    operands.push_back({SPV_OPERAND_TYPE_ID, {function}});
    for (uint32_t id : parameters) {
      operands.push_back({SPV_OPERAND_TYPE_ID, {id}});
    }

    uint32_t result_id = GetContext()->TakeNextId();
    if (result_id == 0) {
      return nullptr;
    }
    std::unique_ptr<Instruction> new_inst(
        new Instruction(GetContext(), spv::Op::OpFunctionCall, result_type,
                        result_id, operands));
    return AddInstruction(std::move(new_inst));
  }